

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O3

int main(void)

{
  byte *pbVar1;
  wtree_node **ppwVar2;
  ulong *puVar3;
  wtree_node *pwVar4;
  undefined8 *puVar5;
  wtree_node *pwVar6;
  long *plVar7;
  wtree_node_t *pwVar8;
  bool bVar9;
  void *__ptr;
  int iVar10;
  uint uVar11;
  int iVar12;
  anon_struct_16_2_62e9fd8f *pathp__1;
  ulong uVar13;
  int *piVar14;
  ulong *puVar15;
  wtree_node_t *pwVar16;
  long lVar17;
  ulong uVar18;
  anon_struct_16_2_62e9fd8f *pathp_;
  int *piVar19;
  char *__function;
  int iVar20;
  wtree_node_t *tnode;
  wtree_node *pwVar21;
  undefined1 auVar22 [8];
  wtree_node_t *pwVar23;
  ulong *puVar24;
  wtree_node_t *pwVar25;
  wtree_node_t *pwVar26;
  wtree_node *pwVar27;
  wtree_node_t *pwVar28;
  ulong uVar29;
  wtree_node_t *left__1;
  char *__assertion;
  uint uVar30;
  wtree_node *pwVar31;
  wtree_node_t *left_;
  bool bVar32;
  ulong local_a28;
  undefined4 local_a20 [10];
  undefined1 local_9f8 [8];
  wtree_walk walk;
  wtree_node_t *local_1f0;
  wtree_node_t *left_1;
  wtree_node_t *local_68;
  wtree_node_t *right;
  wtree_node_t *local_58;
  wtree_node_t *left;
  wtree_node_t *local_48;
  void *local_40;
  wtree_node_t *local_38;
  
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  uVar13 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar13 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar13);
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","check_aug");
  local_40 = calloc(3000,8);
  iVar10 = 0;
  pwVar26 = (wtree_node_t *)0x0;
  pwVar16 = (wtree_node_t *)0x0;
LAB_00101531:
  pwVar23 = pwVar16;
  iVar20 = (int)pwVar23;
  local_38 = (wtree_node_t *)CONCAT44(local_38._4_4_,iVar10);
  if ((0 < iVar20) && (iVar10 = rand(), iVar10 % 100 < 0x14)) {
    iVar10 = rand();
    pwVar16 = *(wtree_node_t **)((long)local_40 + (long)(iVar10 % iVar20) * 8);
    pwVar23 = (wtree_node_t *)(ulong)(iVar20 - 1);
    *(undefined8 *)((long)local_40 + (long)(iVar10 % iVar20) * 8) =
         *(undefined8 *)((long)local_40 + (long)pwVar23 * 8);
    *(undefined8 *)((long)local_40 + (long)pwVar23 * 8) = 0;
    local_9f8 = (undefined1  [8])pwVar26;
    if (pwVar26 == (wtree_node_t *)0x0) {
      puVar15 = (ulong *)0x0;
      piVar14 = (int *)local_9f8;
    }
    else {
      iVar10 = pwVar16->value;
      piVar19 = &walk.path[0].dir;
      pwVar27 = pwVar26;
      do {
        piVar14 = piVar19;
        iVar20 = pwVar27->value;
        uVar11 = (uint)(iVar20 < iVar10);
        if (iVar10 < iVar20) {
          uVar11 = 0xffffffff;
        }
        bVar32 = pwVar27 < pwVar16;
        uVar30 = (uint)bVar32;
        if (!bVar32 && pwVar27 != pwVar16) {
          uVar30 = 0xffffffff;
        }
        if (uVar11 != 0) {
          uVar30 = uVar11;
        }
        *(uint *)&((anon_struct_16_2_62ea00d6 *)(piVar14 + -2))->node = uVar30;
        bVar9 = iVar10 < iVar20;
        if (uVar11 == 0) {
          bVar9 = !bVar32 && pwVar27 != pwVar16;
        }
        if (!bVar9) {
          pwVar27 = (wtree_node *)((ulong)(pwVar27->in_tree).rbn_right_red & 0xfffffffffffffffe);
          *(wtree_node **)piVar14 = pwVar27;
          if (uVar30 != 0) goto LAB_0010160b;
          *(undefined4 *)&((anon_struct_16_2_62ea00d6 *)(piVar14 + -2))->node = 1;
          puVar15 = (ulong *)(piVar14 + -4);
          while (pwVar27 != (wtree_node *)0x0) {
            piVar14[2] = 0xffffffff;
            pwVar27 = (pwVar27->in_tree).rbn_left;
            *(wtree_node **)(piVar14 + 4) = pwVar27;
            piVar14 = piVar14 + 4;
          }
          goto LAB_0010162e;
        }
        pwVar27 = (pwVar27->in_tree).rbn_left;
        *(wtree_node **)piVar14 = pwVar27;
LAB_0010160b:
        piVar19 = piVar14 + 4;
      } while (pwVar27 != (wtree_node *)0x0);
      puVar15 = (ulong *)0x0;
    }
LAB_0010162e:
    if ((wtree_node_t *)*puVar15 != pwVar16) {
      __assertion = "nodep->node == node";
      goto LAB_0010286f;
    }
    puVar3 = (ulong *)(piVar14 + -4);
    pwVar25 = *(wtree_node_t **)(piVar14 + -4);
    auVar22 = (undefined1  [8])pwVar26;
    if (pwVar25 == pwVar16) {
      auVar22 = (undefined1  [8])(pwVar16->in_tree).rbn_left;
      if (auVar22 == (undefined1  [8])0x0) {
        auVar22 = (undefined1  [8])pwVar26;
        if (puVar3 != (ulong *)local_9f8) goto LAB_00101747;
        auVar22 = (undefined1  [8])(wtree_node_t *)0x0;
      }
      else {
        if (((ulong)(pwVar16->in_tree).rbn_right_red & 1) != 0) {
          __assertion = "rbtn_red_get(wtree_node_t, in_tree, node) == false";
          goto LAB_0010286f;
        }
        pwVar27 = (((wtree_node_t *)auVar22)->in_tree).rbn_right_red;
        if (((ulong)pwVar27 & 1) == 0) {
          __assertion = "rbtn_red_get(wtree_node_t, in_tree, left)";
          goto LAB_0010286f;
        }
        (((wtree_node_t *)auVar22)->in_tree).rbn_right_red =
             (wtree_node *)((ulong)pwVar27 & 0xfffffffffffffffe);
        if (puVar3 != (ulong *)local_9f8) {
          puVar15 = (ulong *)(piVar14 + -8);
          if ((int)*(ulong *)(piVar14 + -6) < 0) {
            *(undefined1 (*) [8])*puVar15 = auVar22;
          }
          else {
            *(ulong *)(*puVar15 + 8) =
                 (ulong)((uint)*(undefined8 *)(*puVar15 + 8) & 1) | (ulong)auVar22;
          }
          for (; auVar22 = (undefined1  [8])pwVar26, local_9f8 <= puVar15; puVar15 = puVar15 + -2) {
            plVar7 = (long *)*puVar15;
            *(undefined4 *)((long)plVar7 + 0x14) = 1;
            if (*plVar7 == 0) {
              iVar10 = 1;
            }
            else {
              iVar10 = *(int *)(*plVar7 + 0x14) + 1;
              *(int *)((long)plVar7 + 0x14) = iVar10;
            }
            if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
              *(int *)((long)plVar7 + 0x14) =
                   iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
            }
          }
        }
      }
    }
    else {
      pwVar27 = (pwVar25->in_tree).rbn_right_red;
      uVar13 = (ulong)((uint)(pwVar16->in_tree).rbn_right_red & 1);
      (pwVar25->in_tree).rbn_right_red =
           (wtree_node *)((ulong)pwVar27 & 0xfffffffffffffffe | uVar13);
      (pwVar25->in_tree).rbn_left = (pwVar16->in_tree).rbn_left;
      (pwVar25->in_tree).rbn_right_red =
           (wtree_node *)((ulong)(pwVar16->in_tree).rbn_right_red & 0xfffffffffffffffe | uVar13);
      (pwVar16->in_tree).rbn_right_red =
           (wtree_node *)
           ((ulong)(pwVar16->in_tree).rbn_right_red & 0xfffffffffffffffe |
           (ulong)((uint)pwVar27 & 1));
      *puVar15 = (ulong)pwVar25;
      *puVar3 = (ulong)pwVar16;
      pwVar25 = pwVar16;
      if (puVar15 == (ulong *)local_9f8) {
        auVar22 = (undefined1  [8])*puVar15;
      }
      else if ((int)puVar15[-1] < 0) {
        *(ulong *)puVar15[-2] = *puVar15;
      }
      else {
        *(ulong *)(puVar15[-2] + 8) = (ulong)((uint)*(undefined8 *)(puVar15[-2] + 8) & 1) | *puVar15
        ;
      }
LAB_00101747:
      if (((ulong)(pwVar25->in_tree).rbn_right_red & 1) == 0) {
        *(ulong *)(piVar14 + -4) = 0;
        if (local_9f8 <= piVar14 + -8) {
          puVar15 = (ulong *)(piVar14 + -0xc);
          do {
            if ((int)puVar15[3] == 0) goto LAB_00102836;
            pwVar27 = (wtree_node *)puVar15[4];
            if (-1 < (int)puVar15[3]) {
              puVar3 = (ulong *)puVar15[2];
              pwVar26 = (wtree_node_t *)*puVar3;
              uVar13 = (ulong)((uint)puVar3[1] & 1);
              puVar3[1] = uVar13 | (ulong)pwVar27;
              pwVar21 = (pwVar26->in_tree).rbn_right_red;
              if (((ulong)pwVar21 & 1) == 0) {
                pwVar31 = (pwVar26->in_tree).rbn_left;
                if (uVar13 == 0 && ((ulong)pwVar27 & 1) == 0) {
                  if ((pwVar31 == (wtree_node *)0x0) ||
                     (pwVar27 = (pwVar31->in_tree).rbn_right_red, ((ulong)pwVar27 & 1) == 0)) {
                    (pwVar26->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar21 | 1);
                    *(undefined4 *)((long)puVar3 + 0x14) = 1;
                    iVar10 = pwVar26->weight + 1;
                    *(int *)((long)puVar3 + 0x14) = iVar10;
                    if ((puVar3[1] & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar3 + 0x14) =
                           iVar10 + *(int *)((puVar3[1] & 0xfffffffffffffffe) + 0x14);
                    }
                    goto LAB_00101878;
                  }
                  (pwVar31->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)pwVar27 & 0xfffffffffffffffe);
                  pwVar27 = (pwVar26->in_tree).rbn_right_red;
                  *puVar3 = (ulong)pwVar27 & 0xfffffffffffffffe;
                  (pwVar26->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar27 & 1) | (ulong)puVar3);
                  *(undefined4 *)((long)puVar3 + 0x14) = 1;
                  if (((ulong)pwVar27 & 0xfffffffffffffffe) == 0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14) + 1;
                    *(int *)((long)puVar3 + 0x14) = iVar10;
                  }
                  if ((puVar3[1] & 0xfffffffffffffffe) != 0) {
                    *(int *)((long)puVar3 + 0x14) =
                         iVar10 + *(int *)((puVar3[1] & 0xfffffffffffffffe) + 0x14);
                  }
                  pwVar27 = (pwVar26->in_tree).rbn_left;
                  pwVar26->weight = 1;
                  if (pwVar27 == (wtree_node *)0x0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = pwVar27->weight + 1;
                    pwVar26->weight = iVar10;
                  }
                  if (((ulong)puVar3 & 0xfffffffffffffffe) != 0) {
                    pwVar26->weight = iVar10 + *(int *)(((ulong)puVar3 & 0xfffffffffffffffe) + 0x14)
                    ;
                  }
                  if (puVar15 + 2 != (ulong *)local_9f8) {
                    if ((int)puVar15[1] < 0) {
                      *(wtree_node_t **)*puVar15 = pwVar26;
                      pwVar26 = (wtree_node_t *)auVar22;
                    }
                    else {
                      *(ulong *)(*puVar15 + 8) =
                           (ulong)((uint)*(undefined8 *)(*puVar15 + 8) & 1) | (ulong)pwVar26;
                      pwVar26 = (wtree_node_t *)auVar22;
                    }
                  }
                  for (; auVar22 = (undefined1  [8])pwVar26, local_9f8 <= puVar15;
                      puVar15 = puVar15 + -2) {
                    plVar7 = (long *)*puVar15;
                    *(undefined4 *)((long)plVar7 + 0x14) = 1;
                    if (*plVar7 == 0) {
                      iVar10 = 1;
                    }
                    else {
                      iVar10 = *(int *)(*plVar7 + 0x14) + 1;
                      *(int *)((long)plVar7 + 0x14) = iVar10;
                    }
                    if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
                      *(int *)((long)plVar7 + 0x14) =
                           iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
                    }
                    pwVar26 = (wtree_node_t *)auVar22;
                  }
                }
                else {
                  puVar24 = puVar15 + 2;
                  if ((pwVar31 == (wtree_node *)0x0) ||
                     (((ulong)(pwVar31->in_tree).rbn_right_red & 1) == 0)) {
                    (pwVar26->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar21 | 1);
                    *(byte *)(puVar3 + 1) = (byte)puVar3[1] & 0xfe;
                    for (; local_9f8 <= puVar24; puVar24 = puVar24 + -2) {
                      plVar7 = (long *)*puVar24;
                      *(undefined4 *)((long)plVar7 + 0x14) = 1;
                      if (*plVar7 == 0) {
                        iVar10 = 1;
                      }
                      else {
                        iVar10 = *(int *)(*plVar7 + 0x14) + 1;
                        *(int *)((long)plVar7 + 0x14) = iVar10;
                      }
                      if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
                        *(int *)((long)plVar7 + 0x14) =
                             iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
                      }
                    }
                  }
                  else {
                    puVar3[1] = (ulong)pwVar27 & 0xfffffffffffffffe;
                    ppwVar2 = &(pwVar26->in_tree).rbn_right_red;
                    *(byte *)ppwVar2 = *(byte *)ppwVar2 | 1;
                    ppwVar2 = &(pwVar31->in_tree).rbn_right_red;
                    *(byte *)ppwVar2 = *(byte *)ppwVar2 & 0xfe;
                    pwVar27 = (pwVar26->in_tree).rbn_right_red;
                    *puVar3 = (ulong)pwVar27 & 0xfffffffffffffffe;
                    (pwVar26->in_tree).rbn_right_red =
                         (wtree_node *)((ulong)((uint)pwVar27 & 1) | (ulong)puVar3);
                    *(undefined4 *)((long)puVar3 + 0x14) = 1;
                    if (((ulong)pwVar27 & 0xfffffffffffffffe) == 0) {
                      iVar10 = 1;
                    }
                    else {
                      iVar10 = *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14) + 1;
                      *(int *)((long)puVar3 + 0x14) = iVar10;
                    }
                    if ((puVar3[1] & 0xfffffffffffffffe) != 0) {
                      *(int *)((long)puVar3 + 0x14) =
                           iVar10 + *(int *)((puVar3[1] & 0xfffffffffffffffe) + 0x14);
                    }
                    pwVar27 = (pwVar26->in_tree).rbn_left;
                    pwVar26->weight = 1;
                    if (pwVar27 == (wtree_node *)0x0) {
                      iVar10 = 1;
                    }
                    else {
                      iVar10 = pwVar27->weight + 1;
                      pwVar26->weight = iVar10;
                    }
                    if (((ulong)puVar3 & 0xfffffffffffffffe) != 0) {
                      pwVar26->weight =
                           iVar10 + *(int *)(((ulong)puVar3 & 0xfffffffffffffffe) + 0x14);
                    }
                    if (puVar24 <= local_9f8) goto LAB_0010287f;
                    if ((int)puVar15[1] < 0) {
                      *(wtree_node_t **)*puVar15 = pwVar26;
                    }
                    else {
                      *(ulong *)(*puVar15 + 8) =
                           (ulong)((uint)*(undefined8 *)(*puVar15 + 8) & 1) | (ulong)pwVar26;
                    }
                    for (; local_9f8 <= puVar15; puVar15 = puVar15 + -2) {
                      plVar7 = (long *)*puVar15;
                      *(undefined4 *)((long)plVar7 + 0x14) = 1;
                      if (*plVar7 == 0) {
                        iVar10 = 1;
                      }
                      else {
                        iVar10 = *(int *)(*plVar7 + 0x14) + 1;
                        *(int *)((long)plVar7 + 0x14) = iVar10;
                      }
                      if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
                        *(int *)((long)plVar7 + 0x14) =
                             iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
                      }
                    }
                  }
                }
              }
              else {
                lVar17 = *(long *)((ulong)pwVar21 & 0xfffffffffffffffe);
                if ((lVar17 == 0) || ((*(ulong *)(lVar17 + 8) & 1) == 0)) {
                  pbVar1 = (byte *)((long *)((ulong)pwVar21 & 0xfffffffffffffffe) + 1);
                  *pbVar1 = *pbVar1 | 1;
                  pwVar27 = (pwVar26->in_tree).rbn_right_red;
                  *puVar3 = (ulong)pwVar27 & 0xfffffffffffffffe;
                  (pwVar26->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar27 & 1) | (ulong)puVar3);
                  *(undefined4 *)((long)puVar3 + 0x14) = 1;
                  if (((ulong)pwVar27 & 0xfffffffffffffffe) == 0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14) + 1;
                    *(int *)((long)puVar3 + 0x14) = iVar10;
                  }
                  if ((puVar3[1] & 0xfffffffffffffffe) != 0) {
                    *(int *)((long)puVar3 + 0x14) =
                         iVar10 + *(int *)((puVar3[1] & 0xfffffffffffffffe) + 0x14);
                  }
                  pwVar27 = (pwVar26->in_tree).rbn_left;
                  pwVar26->weight = 1;
                  if (pwVar27 == (wtree_node *)0x0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = pwVar27->weight + 1;
                    pwVar26->weight = iVar10;
                  }
                  pwVar27 = (wtree_node *)((ulong)puVar3 & 0xfffffffffffffffe);
                  if (pwVar27 != (wtree_node *)0x0) {
                    pwVar26->weight = iVar10 + pwVar27->weight;
                  }
                  (pwVar26->in_tree).rbn_right_red = pwVar27;
                  pwVar25 = pwVar26;
                }
                else {
                  *(ulong *)(lVar17 + 8) = *(ulong *)(lVar17 + 8) & 0xfffffffffffffffe;
                  pwVar27 = (pwVar26->in_tree).rbn_right_red;
                  pwVar25 = (wtree_node_t *)((ulong)pwVar27 & 0xfffffffffffffffe);
                  (pwVar26->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar27 & 1) | (ulong)puVar3);
                  pwVar27 = (pwVar25->in_tree).rbn_right_red;
                  *puVar3 = (ulong)pwVar27 & 0xfffffffffffffffe;
                  (pwVar25->in_tree).rbn_right_red =
                       (wtree_node *)((ulong)((uint)pwVar27 & 1) | (ulong)puVar3);
                  uVar13 = (ulong)((uint)(pwVar26->in_tree).rbn_right_red & 1);
                  (pwVar26->in_tree).rbn_right_red =
                       (wtree_node *)((long)&(pwVar25->in_tree).rbn_left + uVar13);
                  *(undefined4 *)((long)puVar3 + 0x14) = 1;
                  if (((ulong)pwVar27 & 0xfffffffffffffffe) == 0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14) + 1;
                    *(int *)((long)puVar3 + 0x14) = iVar10;
                  }
                  if ((puVar3[1] & 0xfffffffffffffffe) != 0) {
                    *(int *)((long)puVar3 + 0x14) =
                         iVar10 + *(int *)((puVar3[1] & 0xfffffffffffffffe) + 0x14);
                  }
                  pwVar27 = (pwVar25->in_tree).rbn_left;
                  pwVar21 = (pwVar25->in_tree).rbn_right_red;
                  pwVar25->weight = 1;
                  if (pwVar27 == (wtree_node *)0x0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = pwVar27->weight + 1;
                    pwVar25->weight = iVar10;
                  }
                  uVar18 = (ulong)pwVar21 & 0xfffffffffffffffe;
                  if (uVar18 != 0) {
                    pwVar25->weight = iVar10 + *(int *)(uVar18 + 0x14);
                  }
                  (pwVar26->in_tree).rbn_right_red = (wtree_node *)(uVar13 | (ulong)pwVar27);
                  (pwVar25->in_tree).rbn_left = pwVar26;
                  pwVar21 = (pwVar26->in_tree).rbn_left;
                  pwVar26->weight = 1;
                  if (pwVar21 == (wtree_node *)0x0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = pwVar21->weight + 1;
                    pwVar26->weight = iVar10;
                  }
                  if (((ulong)pwVar27 & 0xfffffffffffffffe) != 0) {
                    pwVar26->weight =
                         iVar10 + *(int *)(((ulong)pwVar27 & 0xfffffffffffffffe) + 0x14);
                  }
                  pwVar27 = (pwVar25->in_tree).rbn_right_red;
                  pwVar25->weight = 1;
                  iVar10 = pwVar26->weight + 1;
                  pwVar25->weight = iVar10;
                  uVar13 = (ulong)pwVar27 & 0xfffffffffffffffe;
                  if (uVar13 != 0) {
                    pwVar25->weight = iVar10 + *(int *)(uVar13 + 0x14);
                  }
                }
                if (puVar15 + 2 != (ulong *)local_9f8) {
                  if ((int)puVar15[1] < 0) {
                    *(wtree_node_t **)*puVar15 = pwVar25;
                    pwVar25 = (wtree_node_t *)auVar22;
                  }
                  else {
                    *(ulong *)(*puVar15 + 8) =
                         (ulong)((uint)*(undefined8 *)(*puVar15 + 8) & 1) | (ulong)pwVar25;
                    pwVar25 = (wtree_node_t *)auVar22;
                  }
                }
                for (; auVar22 = (undefined1  [8])pwVar25, local_9f8 <= puVar15;
                    puVar15 = puVar15 + -2) {
                  plVar7 = (long *)*puVar15;
                  *(undefined4 *)((long)plVar7 + 0x14) = 1;
                  if (*plVar7 == 0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = *(int *)(*plVar7 + 0x14) + 1;
                    *(int *)((long)plVar7 + 0x14) = iVar10;
                  }
                  if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
                    *(int *)((long)plVar7 + 0x14) =
                         iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
                  }
                  pwVar25 = (wtree_node_t *)auVar22;
                }
              }
              goto LAB_001020f4;
            }
            pwVar21 = (wtree_node *)puVar15[2];
            (pwVar21->in_tree).rbn_left = pwVar27;
            pwVar27 = (pwVar21->in_tree).rbn_right_red;
            if (((ulong)pwVar27 & 1) != 0) {
              pwVar27 = (wtree_node *)((ulong)pwVar27 & 0xfffffffffffffffe);
              pwVar31 = (pwVar27->in_tree).rbn_left;
              if ((pwVar31 == (wtree_node *)0x0) ||
                 (((ulong)(pwVar31->in_tree).rbn_right_red & 1) == 0)) {
                (pwVar21->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar31 | 1);
                (pwVar27->in_tree).rbn_left = pwVar21;
                pwVar6 = (pwVar21->in_tree).rbn_left;
                pwVar21->weight = 1;
                if (pwVar6 == (wtree_node *)0x0) {
                  iVar10 = 1;
                }
                else {
                  iVar10 = pwVar6->weight + 1;
                  pwVar21->weight = iVar10;
                }
                if (((ulong)pwVar31 & 0xfffffffffffffffe) != 0) {
                  pwVar21->weight = iVar10 + *(int *)(((ulong)pwVar31 & 0xfffffffffffffffe) + 0x14);
                }
                pwVar31 = (pwVar27->in_tree).rbn_right_red;
                pwVar27->weight = 1;
                iVar10 = pwVar21->weight + 1;
                pwVar27->weight = iVar10;
              }
              else {
                (pwVar21->in_tree).rbn_right_red = pwVar27;
                pwVar6 = (pwVar31->in_tree).rbn_right_red;
                (pwVar27->in_tree).rbn_left = (wtree_node *)((ulong)pwVar6 & 0xfffffffffffffffe);
                (pwVar31->in_tree).rbn_right_red =
                     (wtree_node *)((ulong)((uint)pwVar6 & 1) | (ulong)pwVar27);
                pwVar4 = (pwVar27->in_tree).rbn_right_red;
                pwVar27->weight = 1;
                if (((ulong)pwVar6 & 0xfffffffffffffffe) == 0) {
                  iVar10 = 1;
                }
                else {
                  iVar10 = *(int *)(((ulong)pwVar6 & 0xfffffffffffffffe) + 0x14) + 1;
                  pwVar27->weight = iVar10;
                }
                uVar13 = (ulong)pwVar4 & 0xfffffffffffffffe;
                if (uVar13 != 0) {
                  pwVar27->weight = iVar10 + *(int *)(uVar13 + 0x14);
                }
                pwVar6 = (pwVar31->in_tree).rbn_left;
                pwVar31->weight = 1;
                iVar10 = 1;
                iVar20 = 1;
                if (pwVar6 != (wtree_node *)0x0) {
                  iVar20 = pwVar6->weight + 1;
                  pwVar31->weight = iVar20;
                }
                pwVar31->weight = iVar20 + pwVar27->weight;
                pwVar27 = (wtree_node *)((ulong)pwVar31 & 0xfffffffffffffffe);
                pwVar6 = (pwVar27->in_tree).rbn_left;
                (pwVar21->in_tree).rbn_right_red =
                     (wtree_node *)
                     ((ulong)((*(uint *)&(pwVar21->in_tree).rbn_right_red | (uint)pwVar31) & 1) |
                     (ulong)pwVar6);
                (pwVar27->in_tree).rbn_left = pwVar21;
                pwVar31 = (pwVar21->in_tree).rbn_left;
                pwVar21->weight = 1;
                if (pwVar31 != (wtree_node *)0x0) {
                  iVar10 = pwVar31->weight + 1;
                  pwVar21->weight = iVar10;
                }
                uVar13 = (ulong)pwVar6 & 0xfffffffffffffffe;
                if (uVar13 != 0) {
                  pwVar21->weight = iVar10 + *(int *)(uVar13 + 0x14);
                }
                pwVar31 = (pwVar27->in_tree).rbn_right_red;
                pwVar27->weight = 1;
                iVar10 = pwVar21->weight + 1;
                pwVar27->weight = iVar10;
              }
              if (((ulong)pwVar31 & 0xfffffffffffffffe) != 0) {
                pwVar27->weight = iVar10 + *(int *)(((ulong)pwVar31 & 0xfffffffffffffffe) + 0x14);
              }
              if (local_9f8 < puVar15 + 2) {
                if ((int)puVar15[1] < 0) {
                  *(wtree_node **)*puVar15 = pwVar27;
                }
                else {
                  *(ulong *)(*puVar15 + 8) =
                       (ulong)((uint)*(undefined8 *)(*puVar15 + 8) & 1) | (ulong)pwVar27;
                }
                for (; local_9f8 <= puVar15; puVar15 = puVar15 + -2) {
                  plVar7 = (long *)*puVar15;
                  *(undefined4 *)((long)plVar7 + 0x14) = 1;
                  if (*plVar7 == 0) {
                    iVar10 = 1;
                  }
                  else {
                    iVar10 = *(int *)(*plVar7 + 0x14) + 1;
                    *(int *)((long)plVar7 + 0x14) = iVar10;
                  }
                  if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
                    *(int *)((long)plVar7 + 0x14) =
                         iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
                  }
                }
                goto LAB_001020f4;
              }
LAB_0010287f:
              __assertion = "(uintptr_t)pathp > (uintptr_t)path";
              goto LAB_0010286f;
            }
            pwVar31 = (pwVar27->in_tree).rbn_left;
            if ((pwVar31 != (wtree_node *)0x0) &&
               (pwVar6 = (pwVar31->in_tree).rbn_right_red, ((ulong)pwVar6 & 1) != 0)) {
              (pwVar27->in_tree).rbn_left = (wtree_node *)((ulong)pwVar6 & 0xfffffffffffffffe);
              (pwVar31->in_tree).rbn_right_red = pwVar27;
              pwVar4 = (pwVar27->in_tree).rbn_right_red;
              pwVar27->weight = 1;
              if (((ulong)pwVar6 & 0xfffffffffffffffe) == 0) {
                iVar10 = 1;
              }
              else {
                iVar10 = *(int *)(((ulong)pwVar6 & 0xfffffffffffffffe) + 0x14) + 1;
                pwVar27->weight = iVar10;
              }
              uVar13 = (ulong)pwVar4 & 0xfffffffffffffffe;
              if (uVar13 != 0) {
                pwVar27->weight = iVar10 + *(int *)(uVar13 + 0x14);
              }
              pwVar6 = (pwVar31->in_tree).rbn_left;
              pwVar31->weight = 1;
              iVar10 = 1;
              iVar20 = 1;
              if (pwVar6 != (wtree_node *)0x0) {
                iVar20 = pwVar6->weight + 1;
                pwVar31->weight = iVar20;
              }
              pwVar31->weight = iVar20 + pwVar27->weight;
              pwVar26 = (wtree_node_t *)((ulong)pwVar31 & 0xfffffffffffffffe);
              pwVar27 = (pwVar26->in_tree).rbn_left;
              (pwVar21->in_tree).rbn_right_red =
                   (wtree_node *)
                   ((ulong)((*(uint *)&(pwVar21->in_tree).rbn_right_red | (uint)pwVar31) & 1) |
                   (ulong)pwVar27);
              (pwVar26->in_tree).rbn_left = pwVar21;
              pwVar31 = (pwVar21->in_tree).rbn_left;
              pwVar21->weight = 1;
              if (pwVar31 != (wtree_node *)0x0) {
                iVar10 = pwVar31->weight + 1;
                pwVar21->weight = iVar10;
              }
              uVar13 = (ulong)pwVar27 & 0xfffffffffffffffe;
              if (uVar13 != 0) {
                pwVar21->weight = iVar10 + *(int *)(uVar13 + 0x14);
              }
              pwVar27 = (pwVar26->in_tree).rbn_right_red;
              pwVar26->weight = 1;
              iVar10 = pwVar21->weight + 1;
              pwVar26->weight = iVar10;
              uVar13 = (ulong)pwVar27 & 0xfffffffffffffffe;
              if (uVar13 != 0) {
                pwVar26->weight = iVar10 + *(int *)(uVar13 + 0x14);
              }
              if (puVar15 + 2 != (ulong *)local_9f8) {
                puVar5 = (undefined8 *)*puVar15;
                if ((int)puVar15[1] < 0) {
                  *puVar5 = pwVar26;
                  pwVar26 = (wtree_node_t *)auVar22;
                }
                else {
                  puVar5[1] = (ulong)((uint)puVar5[1] & 1) | (ulong)pwVar26;
                  pwVar26 = (wtree_node_t *)auVar22;
                }
              }
              for (; auVar22 = (undefined1  [8])pwVar26, local_9f8 <= puVar15;
                  puVar15 = puVar15 + -2) {
                plVar7 = (long *)*puVar15;
                *(undefined4 *)((long)plVar7 + 0x14) = 1;
                if (*plVar7 == 0) {
                  iVar10 = 1;
                }
                else {
                  iVar10 = *(int *)(*plVar7 + 0x14) + 1;
                  *(int *)((long)plVar7 + 0x14) = iVar10;
                }
                if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
                  *(int *)((long)plVar7 + 0x14) =
                       iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
                }
                pwVar26 = (wtree_node_t *)auVar22;
              }
              goto LAB_001020f4;
            }
            (pwVar21->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar31 | 1);
            (pwVar27->in_tree).rbn_left = pwVar21;
            pwVar6 = (pwVar21->in_tree).rbn_left;
            pwVar21->weight = 1;
            if (pwVar6 == (wtree_node *)0x0) {
              iVar10 = 1;
            }
            else {
              iVar10 = pwVar6->weight + 1;
              pwVar21->weight = iVar10;
            }
            if (((ulong)pwVar31 & 0xfffffffffffffffe) != 0) {
              pwVar21->weight = iVar10 + *(int *)(((ulong)pwVar31 & 0xfffffffffffffffe) + 0x14);
            }
            pwVar31 = (pwVar27->in_tree).rbn_right_red;
            pwVar27->weight = 1;
            iVar10 = pwVar21->weight + 1;
            pwVar27->weight = iVar10;
            uVar13 = (ulong)pwVar31 & 0xfffffffffffffffe;
            if (uVar13 != 0) {
              pwVar27->weight = iVar10 + *(int *)(uVar13 + 0x14);
            }
            puVar15[2] = (ulong)pwVar27;
LAB_00101878:
            bVar32 = local_9f8 <= puVar15;
            puVar15 = puVar15 + -2;
          } while (bVar32);
        }
        auVar22 = local_9f8;
        if (((ulong)((anon_struct_16_2_6fa94910_for_in_tree *)local_9f8)->rbn_right_red & 1) != 0) {
          __assertion = "rbtn_red_get(wtree_node_t, in_tree, rbtree->rbt_root) == false";
          goto LAB_0010286f;
        }
      }
      else {
        if (-1 < (int)*(ulong *)(piVar14 + -6)) goto LAB_0010284d;
        **(undefined8 **)(piVar14 + -8) = 0;
        for (puVar15 = (ulong *)(piVar14 + -8); local_9f8 <= puVar15; puVar15 = puVar15 + -2) {
          plVar7 = (long *)*puVar15;
          *(undefined4 *)((long)plVar7 + 0x14) = 1;
          if (*plVar7 == 0) {
            iVar10 = 1;
          }
          else {
            iVar10 = *(int *)(*plVar7 + 0x14) + 1;
            *(int *)((long)plVar7 + 0x14) = iVar10;
          }
          if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
            *(int *)((long)plVar7 + 0x14) =
                 iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
          }
        }
      }
    }
LAB_001020f4:
    free(pwVar16);
    pwVar26 = (wtree_node_t *)auVar22;
  }
  pwVar16 = (wtree_node_t *)malloc(0x18);
  *(wtree_node_t **)((long)local_40 + (long)(int)pwVar23 * 8) = pwVar16;
  iVar10 = rand();
  iVar20 = iVar10 % 3000 + 1;
  pwVar16->value = iVar20;
  (pwVar16->in_tree).rbn_left = (wtree_node *)0x0;
  (pwVar16->in_tree).rbn_right_red = (wtree_node *)0x1;
  pwVar16->weight = 1;
  local_9f8 = (undefined1  [8])pwVar26;
  piVar14 = (int *)local_9f8;
  if (pwVar26 != (wtree_node_t *)0x0) {
    pwVar27 = pwVar26;
    do {
      iVar12 = pwVar27->value;
      uVar11 = (uint)(iVar12 <= iVar10 % 3000);
      if (iVar20 < iVar12) {
        uVar11 = 0xffffffff;
      }
      uVar30 = (uint)(pwVar27 < pwVar16);
      if (pwVar16 < pwVar27) {
        uVar30 = 0xffffffff;
      }
      if (uVar11 != 0) {
        uVar30 = uVar11;
      }
      piVar14[2] = uVar30;
      if (uVar30 == 0) {
        __assertion = "cmp != 0";
        __function = "void wtree_insert(wtree_t *, wtree_node_t *)";
        goto LAB_00102827;
      }
      bVar32 = iVar20 < iVar12;
      if (uVar11 == 0) {
        bVar32 = pwVar16 < pwVar27;
      }
      if (bVar32) {
        pwVar27 = (pwVar27->in_tree).rbn_left;
      }
      else {
        pwVar27 = (wtree_node *)((ulong)(pwVar27->in_tree).rbn_right_red & 0xfffffffffffffffe);
      }
      *(wtree_node **)(piVar14 + 4) = pwVar27;
      piVar14 = piVar14 + 4;
    } while (pwVar27 != (wtree_node *)0x0);
  }
  while( true ) {
    *(wtree_node_t **)piVar14 = pwVar16;
    piVar19 = piVar14 + -4;
    if (piVar19 < local_9f8) break;
    pwVar27 = *(wtree_node **)piVar19;
    if (*(int *)&((anon_struct_16_2_62ea00d6 *)(piVar14 + -2))->node < 0) {
      (pwVar27->in_tree).rbn_left = pwVar16;
      if (((ulong)(pwVar16->in_tree).rbn_right_red & 1) == 0) goto joined_r0x001023a2;
      pwVar21 = (pwVar16->in_tree).rbn_left;
      if ((pwVar21 == (wtree_node *)0x0) ||
         (pwVar31 = (pwVar21->in_tree).rbn_right_red, ((ulong)pwVar31 & 1) == 0)) {
        pwVar21 = (pwVar27->in_tree).rbn_right_red;
        pwVar27->weight = 1;
        iVar10 = pwVar16->weight;
LAB_00102235:
        iVar10 = iVar10 + 1;
        pwVar27->weight = iVar10;
        pwVar16 = pwVar27;
      }
      else {
        (pwVar21->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar31 & 0xfffffffffffffffe);
        pwVar21 = (pwVar16->in_tree).rbn_right_red;
        (pwVar27->in_tree).rbn_left = (wtree_node *)((ulong)pwVar21 & 0xfffffffffffffffe);
        (pwVar16->in_tree).rbn_right_red =
             (wtree_node *)((ulong)((uint)pwVar21 & 1) | (ulong)pwVar27);
        pwVar31 = (pwVar27->in_tree).rbn_right_red;
        pwVar27->weight = 1;
        if (((ulong)pwVar21 & 0xfffffffffffffffe) == 0) {
          iVar10 = 1;
        }
        else {
          iVar10 = *(int *)(((ulong)pwVar21 & 0xfffffffffffffffe) + 0x14) + 1;
          pwVar27->weight = iVar10;
        }
        uVar13 = (ulong)pwVar31 & 0xfffffffffffffffe;
        if (uVar13 != 0) {
          pwVar27->weight = iVar10 + *(int *)(uVar13 + 0x14);
        }
        pwVar31 = (pwVar16->in_tree).rbn_left;
        pwVar16->weight = 1;
        pwVar21 = pwVar27;
        if (pwVar31 == (wtree_node *)0x0) {
          iVar10 = 1;
        }
        else {
          iVar10 = pwVar31->weight + 1;
          pwVar16->weight = iVar10;
        }
      }
    }
    else {
      pwVar21 = (wtree_node *)((ulong)((uint)(pwVar27->in_tree).rbn_right_red & 1) | (ulong)pwVar16)
      ;
      (pwVar27->in_tree).rbn_right_red = pwVar21;
      if (((ulong)(pwVar16->in_tree).rbn_right_red & 1) == 0) goto joined_r0x0010240d;
      pwVar31 = (pwVar27->in_tree).rbn_left;
      if ((pwVar31 != (wtree_node *)0x0) &&
         (pwVar6 = (pwVar31->in_tree).rbn_right_red, ((ulong)pwVar6 & 1) != 0)) {
        (pwVar31->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar6 & 0xfffffffffffffffe);
        ppwVar2 = &(pwVar16->in_tree).rbn_right_red;
        *(byte *)ppwVar2 = *(byte *)ppwVar2 & 0xfe;
        pwVar21 = (pwVar27->in_tree).rbn_right_red;
        (pwVar27->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar21 | 1);
        pwVar27->weight = 1;
        iVar10 = pwVar31->weight;
        goto LAB_00102235;
      }
      uVar13 = (ulong)((uint)pwVar21 & 1);
      pwVar16 = (wtree_node_t *)((ulong)pwVar16 & 0xfffffffffffffffe);
      (pwVar27->in_tree).rbn_right_red = (wtree_node *)((ulong)(pwVar16->in_tree).rbn_left | uVar13)
      ;
      (pwVar16->in_tree).rbn_left = pwVar27;
      (pwVar16->in_tree).rbn_right_red =
           (wtree_node *)((ulong)(pwVar16->in_tree).rbn_right_red & 0xfffffffffffffffe | uVar13);
      pwVar21 = (pwVar27->in_tree).rbn_left;
      pwVar31 = (pwVar27->in_tree).rbn_right_red;
      (pwVar27->in_tree).rbn_right_red = (wtree_node *)((ulong)pwVar31 | 1);
      pwVar27->weight = 1;
      if (pwVar21 == (wtree_node *)0x0) {
        iVar10 = 1;
      }
      else {
        iVar10 = pwVar21->weight + 1;
        pwVar27->weight = iVar10;
      }
      uVar13 = (ulong)pwVar31 & 0xfffffffffffffffe;
      if (uVar13 != 0) {
        pwVar27->weight = iVar10 + *(int *)(uVar13 + 0x14);
      }
      pwVar21 = (pwVar16->in_tree).rbn_right_red;
      pwVar16->weight = 1;
      iVar10 = pwVar27->weight + 1;
      pwVar16->weight = iVar10;
    }
    piVar14 = piVar19;
    if (((ulong)pwVar21 & 0xfffffffffffffffe) != 0) {
      pwVar16->weight = iVar10 + *(int *)(((ulong)pwVar21 & 0xfffffffffffffffe) + 0x14);
    }
  }
  ppwVar2 = &(pwVar26->in_tree).rbn_right_red;
  *ppwVar2 = (wtree_node *)((ulong)*ppwVar2 & 0xfffffffffffffffe);
  goto LAB_001023f0;
joined_r0x0010240d:
  for (; local_9f8 <= piVar19; piVar19 = piVar19 + -4) {
    plVar7 = *(long **)piVar19;
    *(undefined4 *)((long)plVar7 + 0x14) = 1;
    if (*plVar7 == 0) {
      iVar10 = 1;
    }
    else {
      iVar10 = *(int *)(*plVar7 + 0x14) + 1;
      *(int *)((long)plVar7 + 0x14) = iVar10;
    }
    if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
      *(int *)((long)plVar7 + 0x14) = iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
    }
  }
  goto LAB_001023f0;
joined_r0x001023a2:
  for (; local_9f8 <= piVar19; piVar19 = piVar19 + -4) {
    plVar7 = *(long **)piVar19;
    *(undefined4 *)((long)plVar7 + 0x14) = 1;
    if (*plVar7 == 0) {
      iVar10 = 1;
    }
    else {
      iVar10 = *(int *)(*plVar7 + 0x14) + 1;
      *(int *)((long)plVar7 + 0x14) = iVar10;
    }
    if ((plVar7[1] & 0xfffffffffffffffeU) != 0) {
      *(int *)((long)plVar7 + 0x14) = iVar10 + *(int *)((plVar7[1] & 0xfffffffffffffffeU) + 0x14);
    }
  }
LAB_001023f0:
  pwVar16 = (wtree_node_t *)(ulong)((int)pwVar23 + 1);
  iVar10 = (int)local_38 + 1;
  if (iVar10 == 3000) goto LAB_0010244b;
  goto LAB_00101531;
LAB_0010244b:
  if (pwVar26 != (wtree_node_t *)0x0) {
    lVar17 = 0;
    pwVar27 = pwVar26;
    do {
      (&local_1f0)[lVar17] = pwVar27;
      pwVar27 = (pwVar27->in_tree).rbn_left;
      if (pwVar27 == (wtree_node *)0x0) {
        uVar11 = (int)lVar17 + 1;
        pwVar25 = (wtree_node_t *)0x0;
        goto LAB_00102490;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x30);
    __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
    __function = "void wtree_ifirst(wtree_t *, struct wtree_iterator *)";
LAB_00102827:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c"
                  ,0x40,__function);
  }
LAB_00102526:
  walk.path[0x2f].dir = 0;
  right = pwVar16;
  local_38 = pwVar26;
  do {
    pwVar16 = wtree_walk_next((wtree_walk *)local_9f8,3,&local_58,&local_68);
    if (pwVar16 == (wtree_node_t *)0x0) goto LAB_00102594;
    if (local_58 == (wtree_node_t *)0x0) {
      iVar10 = 1;
    }
    else {
      iVar10 = local_58->weight + 1;
    }
    if (local_68 == (wtree_node_t *)0x0) {
      iVar20 = 0;
    }
    else {
      iVar20 = local_68->weight;
    }
  } while (pwVar16->weight == iVar20 + iVar10);
  main_cold_2();
LAB_00102594:
  iVar10 = 0;
  do {
    left._4_4_ = iVar10;
    local_48 = pwVar23;
    iVar10 = rand();
    iVar10 = iVar10 % 0x1194 + -0x2ee;
    walk.path[0x2f].dir = 0;
    local_9f8 = (undefined1  [8])local_38;
    pwVar16 = wtree_walk_next((wtree_walk *)local_9f8,0,&local_1f0,&local_58);
    iVar20 = 0;
    if (pwVar16 != (wtree_node_t *)0x0) {
      iVar20 = 0;
      do {
        iVar12 = 1;
        if (pwVar16->value < iVar10) {
          if (local_1f0 != (wtree_node_t *)0x0) {
            iVar20 = iVar20 + local_1f0->weight;
          }
          iVar20 = iVar20 + 1;
          iVar12 = 2;
        }
        pwVar16 = wtree_walk_next((wtree_walk *)local_9f8,iVar12,&local_1f0,&local_58);
      } while (pwVar16 != (wtree_node_t *)0x0);
    }
    pwVar23 = local_48;
    if (local_38 != (wtree_node_t *)0x0) {
      uVar18 = 0;
      pwVar27 = local_38;
      uVar13 = 0;
      while( true ) {
        uVar29 = uVar13 + 1;
        iVar12 = pwVar27->value;
        *(wtree_node **)((long)walk.path + uVar13 * 8 + -8) = pwVar27;
        if ((iVar10 < iVar12) || (iVar10 <= iVar12)) {
          pwVar27 = (pwVar27->in_tree).rbn_left;
        }
        else {
          pwVar27 = (wtree_node *)((ulong)(pwVar27->in_tree).rbn_right_red & 0xfffffffffffffffe);
          uVar18 = uVar29 & 0xffffffff;
        }
        if (pwVar27 == (wtree_node *)0x0) break;
        uVar13 = uVar29;
        if (uVar29 == 0x30) {
          __assertion = "it->count < RB_MAX_TREE_HEIGHT";
          __function = "void wtree_isearch_lt(wtree_t *, int, struct wtree_iterator *)";
          goto LAB_00102827;
        }
      }
      if ((int)uVar18 != 0) {
        iVar10 = 0;
        do {
          uVar11 = (uint)uVar18;
          puVar15 = *(ulong **)((long)walk.path + (ulong)(uVar11 - 1) * 8 + -8);
          uVar13 = *puVar15;
          if (uVar13 == 0) {
            do {
              iVar12 = (int)uVar18;
              if (iVar12 == 1) {
                iVar10 = iVar10 + 1;
                goto LAB_00102707;
              }
              puVar3 = *(ulong **)((long)walk.path + (ulong)(iVar12 - 2) * 8 + -8);
              uVar18 = (ulong)(iVar12 - 1);
              bVar32 = (ulong *)*puVar3 == puVar15;
              puVar15 = puVar3;
            } while (bVar32);
          }
          else {
            uVar29 = 0x30;
            if (0x30 < uVar11) {
              uVar29 = uVar18;
            }
            if (0x2f < uVar11) {
LAB_001027cd:
              __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
              __function = "wtree_node_t *wtree_iprev(struct wtree_iterator *)";
              goto LAB_00102827;
            }
            while( true ) {
              *(ulong *)((long)walk.path + uVar18 * 8 + -8) = uVar13;
              uVar13 = *(ulong *)(uVar13 + 8) & 0xfffffffffffffffe;
              if (uVar13 == 0) break;
              uVar18 = uVar18 + 1;
              if (uVar29 == uVar18) goto LAB_001027cd;
            }
            uVar18 = (ulong)((int)uVar18 + 1);
          }
          iVar10 = iVar10 + 1;
        } while( true );
      }
    }
    iVar10 = 0;
LAB_00102707:
    if (iVar20 != iVar10) {
      main_cold_3();
LAB_00102836:
      __assertion = "pathp->cmp != 0";
LAB_0010286f:
      __function = "void wtree_remove(wtree_t *, wtree_node_t *)";
      goto LAB_00102827;
    }
    iVar10 = left._4_4_ + 1;
    if (iVar10 == 100) {
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/rb_aug.c",0xb5,
          "line %d",0xb5);
      __ptr = local_40;
      if (-1 < (int)pwVar23) {
        uVar13 = (ulong)right & 0xffffffff;
        uVar18 = 0;
        do {
          free(*(void **)((long)__ptr + uVar18 * 8));
          uVar18 = uVar18 + 1;
        } while (uVar13 != uVar18);
      }
      free(__ptr);
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","check_aug");
      check_plan();
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","main");
      iVar10 = check_plan();
      return iVar10;
    }
  } while( true );
LAB_00102490:
  pwVar8 = (&local_1f0)[uVar11 - 1];
  pwVar27 = (wtree_node *)((ulong)(pwVar8->in_tree).rbn_right_red & 0xfffffffffffffffe);
  pwVar28 = pwVar8;
  if (pwVar27 == (wtree_node_t *)0x0) {
    do {
      if (uVar11 == 1) {
        uVar11 = 0;
        break;
      }
      uVar30 = uVar11 - 2;
      uVar11 = uVar11 - 1;
      bVar32 = pwVar28 ==
               (wtree_node_t *)
               ((ulong)((&local_1f0)[uVar30]->in_tree).rbn_right_red & 0xfffffffffffffffe);
      pwVar28 = (&local_1f0)[uVar30];
    } while (bVar32);
  }
  else {
    uVar13 = 0x30;
    if (0x30 < uVar11) {
      uVar13 = (ulong)uVar11;
    }
    if (0x2f < uVar11) {
LAB_00102812:
      __assertion = "(it)->count < RB_MAX_TREE_HEIGHT";
      __function = "wtree_node_t *wtree_inext(struct wtree_iterator *)";
      goto LAB_00102827;
    }
    uVar18 = (ulong)uVar11;
    while( true ) {
      (&local_1f0)[uVar18] = pwVar27;
      pwVar27 = (pwVar27->in_tree).rbn_left;
      if (pwVar27 == (wtree_node *)0x0) break;
      uVar18 = uVar18 + 1;
      if (uVar13 == uVar18) goto LAB_00102812;
    }
    uVar11 = (int)uVar18 + 1;
  }
  if (pwVar8 != (wtree_node_t *)0x0) {
    if ((pwVar25 == (wtree_node_t *)0x0) || (pwVar25->value <= pwVar8->value)) goto LAB_0010251b;
    main_cold_1();
LAB_0010284d:
    __assertion = "pathp[-1].cmp < 0";
    goto LAB_0010286f;
  }
  goto LAB_00102526;
LAB_0010251b:
  pwVar25 = pwVar8;
  if (uVar11 == 0) goto LAB_00102526;
  goto LAB_00102490;
}

Assistant:

int main()
{
	plan(1);
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	check_aug();

	footer();
	return check_plan();
}